

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O1

long testValidateNewOrderSingle(int count)

{
  FieldMap *this;
  __time_t _Var1;
  __suseconds_t _Var2;
  long lVar3;
  long lVar4;
  timeval tv;
  Symbol symbol;
  ClOrdID clOrdID;
  TransactTime transactTime;
  Side side;
  HandlInst handlInst;
  OrdType ordType;
  DataDictionary dataDictionary;
  NewOrderSingle message;
  timeval local_7d0;
  long local_7c0 [2];
  undefined1 local_7b0 [16];
  _Alloc_hider local_7a0;
  char local_790 [16];
  _Alloc_hider local_780;
  size_type local_778;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_770;
  size_t local_760;
  int local_758;
  undefined1 local_750 [16];
  _Alloc_hider local_740;
  char local_730 [16];
  _Alloc_hider local_720;
  size_type local_718;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_710;
  size_t local_700;
  int local_6f8;
  FieldBase local_6f0;
  FieldBase local_690;
  FieldBase local_630;
  FieldBase local_5d0;
  undefined1 local_570 [16];
  _Alloc_hider local_560 [2];
  char local_550 [16];
  _Alloc_hider local_540;
  size_type local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  size_t local_520;
  int local_518;
  undefined1 local_188 [344];
  
  local_570._0_8_ = local_560;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"ORDERID","");
  local_750._0_8_ = &PTR__FieldBase_0011c5d8;
  local_750._8_4_ = 0xb;
  local_740._M_p = local_730;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_740,local_570._0_8_,
             (long)(pointer *)local_570._0_8_ + CONCAT44(local_570._12_4_,local_570._8_4_));
  local_720._M_p = (pointer)&local_710;
  local_718 = 0;
  local_710._M_local_buf[0] = '\0';
  local_700 = 0;
  local_6f8 = 0;
  local_750._0_8_ = &PTR__FieldBase_0011c658;
  if ((_Alloc_hider *)local_570._0_8_ != local_560) {
    operator_delete((void *)local_570._0_8_,(ulong)(local_560[0]._M_p + 1));
  }
  FIX::CharField::CharField((CharField *)&local_630,0x15,'1');
  local_630._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c690;
  local_570._0_8_ = local_560;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"LNUX","");
  local_7b0._0_8_ = &PTR__FieldBase_0011c5d8;
  local_7b0._8_4_ = 0x37;
  local_7a0._M_p = local_790;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7a0,local_570._0_8_,
             (long)(pointer *)local_570._0_8_ + CONCAT44(local_570._12_4_,local_570._8_4_));
  local_780._M_p = (pointer)&local_770;
  local_778 = 0;
  local_770._M_local_buf[0] = '\0';
  local_760 = 0;
  local_758 = 0;
  local_7b0._0_8_ = &PTR__FieldBase_0011c700;
  if ((_Alloc_hider *)local_570._0_8_ != local_560) {
    operator_delete((void *)local_570._0_8_,(ulong)(local_560[0]._M_p + 1));
  }
  FIX::CharField::CharField((CharField *)&local_690,0x36,'1');
  local_690._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c738;
  FIX::UtcTimeStampField::UtcTimeStampField((UtcTimeStampField *)&local_6f0,0x3c,0);
  local_6f0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c770;
  FIX::CharField::CharField((CharField *)&local_5d0,0x28,'1');
  local_5d0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c848;
  FIX42::NewOrderSingle::NewOrderSingle
            ((NewOrderSingle *)local_188,(ClOrdID *)local_750,(HandlInst *)&local_630,
             (Symbol *)local_7b0,(Side *)&local_690,(TransactTime *)&local_6f0,(OrdType *)&local_5d0
            );
  local_7d0.tv_sec = (__time_t)local_7c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"SENDER","");
  local_570._0_8_ = &PTR__FieldBase_0011c5d8;
  local_570._8_4_ = 0x31;
  local_560[0]._M_p = local_550;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_560,local_7d0.tv_sec,local_7d0.tv_usec + local_7d0.tv_sec);
  this = (FieldMap *)(local_188 + 0x70);
  local_538 = 0;
  local_530._M_local_buf[0] = '\0';
  local_520 = 0;
  local_518 = 0;
  local_570._0_8_ = &PTR__FieldBase_0011cc10;
  local_540._M_p = (pointer)&local_530;
  FIX::FieldMap::setField(this,(FieldBase *)local_570,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_570);
  if ((long *)local_7d0.tv_sec != local_7c0) {
    operator_delete((void *)local_7d0.tv_sec,local_7c0[0] + 1);
  }
  local_7d0.tv_sec = (__time_t)local_7c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"TARGET","");
  local_570._0_8_ = &PTR__FieldBase_0011c5d8;
  local_570._8_4_ = 0x38;
  local_560[0]._M_p = local_550;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_560,local_7d0.tv_sec,local_7d0.tv_usec + local_7d0.tv_sec);
  local_538 = 0;
  local_530._M_local_buf[0] = '\0';
  local_520 = 0;
  local_518 = 0;
  local_570._0_8_ = &PTR__FieldBase_0011cc48;
  local_540._M_p = (pointer)&local_530;
  FIX::FieldMap::setField(this,(FieldBase *)local_570,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_570);
  if ((long *)local_7d0.tv_sec != local_7c0) {
    operator_delete((void *)local_7d0.tv_sec,local_7c0[0] + 1);
  }
  FIX::IntField::IntField((IntField *)local_570,0x22,1);
  local_570._0_8_ = &PTR__FieldBase_0011cc80;
  FIX::FieldMap::setField(this,(FieldBase *)local_570,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_570);
  FIX::DataDictionary::DataDictionary((DataDictionary *)local_570);
  gettimeofday(&local_7d0,(__timezone_ptr_t)0x0);
  _Var2 = local_7d0.tv_usec;
  _Var1 = local_7d0.tv_sec;
  if (0 < count) {
    do {
      FIX::DataDictionary::validate
                ((Message *)local_188,(DataDictionary *)local_570,(DataDictionary *)local_570);
      count = count + -1;
    } while (count != 0);
  }
  lVar4 = SUB168(SEXT816(_Var2) * SEXT816(-0x20c49ba5e353f7cf),8);
  gettimeofday(&local_7d0,(__timezone_ptr_t)0x0);
  lVar3 = local_7d0.tv_sec - _Var1;
  FIX::DataDictionary::~DataDictionary((DataDictionary *)local_570);
  FIX::Message::~Message((Message *)local_188);
  FIX::FieldBase::~FieldBase(&local_5d0);
  FIX::FieldBase::~FieldBase(&local_6f0);
  FIX::FieldBase::~FieldBase(&local_690);
  FIX::FieldBase::~FieldBase((FieldBase *)local_7b0);
  FIX::FieldBase::~FieldBase(&local_630);
  FIX::FieldBase::~FieldBase((FieldBase *)local_750);
  return lVar3 * 1000 + local_7d0.tv_usec / 1000 + ((lVar4 >> 7) - (lVar4 >> 0x3f));
}

Assistant:

long testValidateNewOrderSingle( int count )
{
  FIX::ClOrdID clOrdID( "ORDERID" );
  FIX::HandlInst handlInst( '1' );
  FIX::Symbol symbol( "LNUX" );
  FIX::Side side( FIX::Side_BUY );
  FIX::TransactTime transactTime;
  FIX::OrdType ordType( FIX::OrdType_MARKET );
  FIX42::NewOrderSingle message
  ( clOrdID, handlInst, symbol, side, transactTime, ordType );
  message.getHeader().set( FIX::SenderCompID( "SENDER" ) );
  message.getHeader().set( FIX::TargetCompID( "TARGET" ) );
  message.getHeader().set( FIX::MsgSeqNum( 1 ) );

  FIX::DataDictionary dataDictionary;
  count = count - 1;

  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    dataDictionary.validate( message );
  }
  return GetTickCount() - start;
}